

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  uchar uVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  uchar *data;
  uchar *puVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __size;
  ulong uVar11;
  uint uVar12;
  size_t sVar13;
  bool bVar14;
  
  LVar2 = info->colortype;
  if (LVar2 == LCT_GREY) {
    if (info->key_defined != 0) {
      uVar3 = info->key_r;
      data = (uchar *)malloc(1);
      if (data != (uchar *)0x0) {
        *data = (uchar)(uVar3 >> 8);
      }
      uVar10 = (ulong)(data != (uchar *)0x0);
      puVar4 = (uchar *)realloc(data,uVar10 * 2 + 1);
      if (puVar4 == (uchar *)0x0) goto LAB_0018c2d7;
      uVar11 = uVar10 + 1;
      puVar5 = puVar4 + uVar11;
      data = puVar4;
LAB_0018c2d3:
      puVar5[-1] = (uchar)uVar3;
      uVar10 = uVar11;
      goto LAB_0018c2d7;
    }
  }
  else if (LVar2 == LCT_RGB) {
    if (info->key_defined != 0) {
      uVar3 = info->key_r;
      data = (uchar *)malloc(1);
      bVar14 = data != (uchar *)0x0;
      if (bVar14) {
        *data = (uchar)(uVar3 >> 8);
      }
      uVar10 = (ulong)bVar14;
      __size = uVar10 + uVar10 + 1;
      puVar4 = (uchar *)realloc(data,__size);
      sVar9 = (ulong)bVar14;
      if (puVar4 != (uchar *)0x0) {
        puVar4[uVar10] = (uchar)uVar3;
        uVar10 = uVar10 + 1;
        sVar9 = __size;
        data = puVar4;
      }
      uVar1 = *(uchar *)((long)&info->key_g + 1);
      uVar11 = uVar10 + 1;
      if ((uint)uVar10 < (uint)sVar9) {
        bVar14 = false;
      }
      else {
        uVar8 = 0;
        if ((uint)uVar10 < (uint)sVar9 * 2) {
          uVar8 = uVar11 >> 1;
        }
        puVar4 = (uchar *)realloc(data,uVar8 + uVar11);
        bVar14 = puVar4 == (uchar *)0x0;
        if (!bVar14) {
          data = puVar4;
          sVar9 = uVar8 + uVar11;
        }
      }
      if (!bVar14) {
        data[uVar10] = uVar1;
        uVar10 = uVar11;
      }
      uVar3 = info->key_g;
      uVar11 = uVar10 + 1;
      if ((uint)uVar10 < (uint)sVar9) {
        bVar14 = false;
      }
      else {
        uVar8 = 0;
        if ((uint)uVar10 < (uint)sVar9 * 2) {
          uVar8 = uVar11 >> 1;
        }
        puVar4 = (uchar *)realloc(data,uVar8 + uVar11);
        bVar14 = puVar4 == (uchar *)0x0;
        if (!bVar14) {
          data = puVar4;
          sVar9 = uVar8 + uVar11;
        }
      }
      uVar12 = (uint)sVar9;
      if (!bVar14) {
        data[uVar10] = (uchar)uVar3;
        uVar10 = uVar11;
      }
      uVar1 = *(uchar *)((long)&info->key_b + 1);
      uVar11 = uVar10 + 1;
      uVar3 = (uint)uVar11;
      if (uVar12 < uVar3) {
        uVar8 = (ulong)(uVar3 * 3 >> 1);
        if (uVar12 * 2 < uVar3) {
          uVar8 = uVar11;
        }
        puVar4 = (uchar *)realloc(data,uVar8);
        bVar14 = puVar4 == (uchar *)0x0;
        if (!bVar14) {
          data = puVar4;
          sVar9 = uVar8;
        }
        uVar12 = (uint)sVar9;
      }
      else {
        bVar14 = false;
      }
      if (!bVar14) {
        data[uVar10] = uVar1;
        uVar10 = uVar11;
      }
      uVar3 = info->key_b;
      uVar11 = uVar10 + 1;
      uVar6 = (uint)uVar11;
      if (uVar12 < uVar6) {
        uVar8 = (ulong)(uVar6 * 3 >> 1);
        if (uVar12 * 2 < uVar6) {
          uVar8 = uVar11;
        }
        puVar4 = (uchar *)realloc(data,uVar8);
        bVar14 = puVar4 == (uchar *)0x0;
        if (!bVar14) {
          data = puVar4;
        }
      }
      else {
        bVar14 = false;
      }
      if (bVar14) goto LAB_0018c2d7;
      puVar5 = data + uVar11;
      goto LAB_0018c2d3;
    }
  }
  else {
    data = (uchar *)0x0;
    uVar10 = 0;
    if (LVar2 != LCT_PALETTE) goto LAB_0018c2d7;
    sVar13 = info->palettesize;
    if (sVar13 != 0) {
      do {
        if (info->palette[sVar13 * 4 + -1] != 0xff) goto LAB_0018bfec;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
      sVar13 = 0;
    }
LAB_0018bfec:
    if (sVar13 != 0) {
      sVar7 = 0;
      sVar9 = 0;
      uVar10 = 0;
      data = (uchar *)0x0;
      do {
        uVar1 = info->palette[sVar7 * 4 + 3];
        uVar11 = uVar10 + 1;
        if (sVar9 < uVar11) {
          uVar8 = uVar11 * 3 >> 1;
          if (sVar9 * 2 < uVar11) {
            uVar8 = uVar11;
          }
          puVar4 = (uchar *)realloc(data,uVar8);
          if (puVar4 == (uchar *)0x0) {
            bVar14 = true;
          }
          else {
            bVar14 = false;
            data = puVar4;
            sVar9 = uVar8;
          }
        }
        else {
          bVar14 = false;
        }
        if (!bVar14) {
          data[uVar10] = uVar1;
          uVar10 = uVar11;
        }
        sVar7 = sVar7 + 1;
      } while (sVar13 != sVar7);
      goto LAB_0018c2d7;
    }
  }
  data = (uchar *)0x0;
  uVar10 = 0;
LAB_0018c2d7:
  uVar3 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar10,"tRNS",data);
  if (uVar3 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) --amount;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i != amount; ++i) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g % 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b / 256));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b % 256));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}